

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O0

char * Nnc_LayerType2Str(char *pStr)

{
  int iVar1;
  char *pStr_local;
  
  iVar1 = strcmp(pStr,"InputLayer");
  if (iVar1 == 0) {
    pStr_local = "input  ";
  }
  else {
    iVar1 = strcmp(pStr,"Conv2D");
    if (iVar1 == 0) {
      pStr_local = "convo  ";
    }
    else {
      iVar1 = strcmp(pStr,"BatchNormalization");
      if (iVar1 == 0) {
        pStr_local = "batch  ";
      }
      else {
        iVar1 = strcmp(pStr,"Activation");
        if (iVar1 == 0) {
          pStr_local = "relu   ";
        }
        else {
          iVar1 = strcmp(pStr,"Add");
          if (iVar1 == 0) {
            pStr_local = "eltwise";
          }
          else {
            iVar1 = strcmp(pStr,"MaxPooling2D");
            if (iVar1 == 0) {
              pStr_local = "pool   ";
            }
            else {
              iVar1 = strcmp(pStr,"GlobalAveragePooling2D");
              if (iVar1 == 0) {
                pStr_local = "pool   ";
              }
              else {
                iVar1 = strcmp(pStr,"Dense");
                if (iVar1 == 0) {
                  pStr_local = "fullcon";
                }
                else {
                  iVar1 = strcmp(pStr,"ZeroPadding2D");
                  if (iVar1 == 0) {
                    pStr_local = "pad";
                  }
                  else {
                    pStr_local = (char *)0x0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pStr_local;
}

Assistant:

char * Nnc_LayerType2Str( char * pStr )
{
    if ( !strcmp(pStr, "InputLayer") )
        return "input  ";
    if ( !strcmp(pStr, "Conv2D") )
        return "convo  ";
    if ( !strcmp(pStr, "BatchNormalization") )
        return "batch  ";
    if ( !strcmp(pStr, "Activation") )
        return "relu   ";
    if ( !strcmp(pStr, "Add") )
        return "eltwise";
    if ( !strcmp(pStr, "MaxPooling2D") )
        return "pool   ";
    if ( !strcmp(pStr, "GlobalAveragePooling2D") )
        return "pool   ";
    if ( !strcmp(pStr, "Dense") )
        return "fullcon";
    if ( !strcmp(pStr, "ZeroPadding2D") )
        return "pad";
//    if ( !strcmp(pStr, "InputLayer") )
//        return "softmax";
    return NULL;
}